

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O3

void __thiscall MultiANN::MultiANN(MultiANN *this,int dim,int k,int *tt,ANNpoint ss)

{
  int *piVar1;
  ANNpoint pAVar2;
  ANNpointArray ppAVar3;
  void **ppvVar4;
  long lVar5;
  ulong uVar6;
  
  this->NumNeighbors = k;
  this->dimension = dim;
  this->LastNodeCount = 0;
  this->size = 0;
  uVar6 = 0xffffffffffffffff;
  if (-1 < dim) {
    uVar6 = (ulong)(uint)dim << 2;
  }
  piVar1 = (int *)operator_new__(uVar6);
  this->topology = piVar1;
  pAVar2 = annAllocPt(dim,0.0);
  this->scaling = pAVar2;
  ppAVar3 = annAllocPts(1000000,this->dimension);
  this->points_coor = ppAVar3;
  ppvVar4 = (void **)operator_new__(8000000);
  this->points_ptr = ppvVar4;
  if (0 < this->dimension) {
    piVar1 = this->topology;
    pAVar2 = this->scaling;
    lVar5 = 0;
    do {
      piVar1[lVar5] = tt[lVar5];
      pAVar2[lVar5] = ss[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->dimension);
  }
  memset(this->AnnArray,0,0xf8);
  return;
}

Assistant:

MultiANN::MultiANN(  // constructor
    int dim,         // dimension of the space
    int k,           // number of nearest neighbors to be returned
    int *tt,         // topology of the space
    ANNpoint ss)     // scaling of the coordinates
{
    NumNeighbors = k;
    dimension = dim;
    LastNodeCount = 0;
    size = 0;

    topology = new int[dimension];                    // allocate topology array
    scaling = annAllocPt(dimension);                  // allocate scaling array
    points_coor = annAllocPts(MAXPOINTS, dimension);  // allocate data points
    points_ptr = new void *[MAXPOINTS];  // allocate pointers to the data points

    for (int i = 0; i < dimension; i++) {
        topology[i] = tt[i];
        scaling[i] = ss[i];
    }

    for (int k = 0; k < ANN_MAXIMUM_INDEX + 1; k++) {
        AnnArray[k] = NULL;
    }
}